

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::ExtensionSet::
FindExtensionInfoFromFieldNumber<google::protobuf::internal::DescriptorPoolExtensionFinder>
          (ExtensionSet *this,int wire_type,int field_number,
          DescriptorPoolExtensionFinder *extension_finder,ExtensionInfo *extension,
          bool *was_packed_on_wire)

{
  WireType type;
  bool bVar1;
  LogMessageFatal local_30 [16];
  
  bVar1 = DescriptorPoolExtensionFinder::Find(extension_finder,field_number,extension);
  if (bVar1) {
    if ((byte)(extension->type - 0x13) < 0xee) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.h"
                 ,0x3af,0x48,
                 "extension->type > 0 && extension->type <= WireFormatLite::MAX_FIELD_TYPE");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
    }
    type = *(WireType *)(WireFormatLite::kWireTypeForFieldType + (ulong)extension->type * 4);
    *was_packed_on_wire = false;
    if (((wire_type == 2) && (extension->is_repeated != false)) &&
       (bVar1 = is_packable(type), bVar1)) {
      *was_packed_on_wire = true;
      return true;
    }
    bVar1 = type == wire_type;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FindExtensionInfoFromFieldNumber(int wire_type, int field_number,
                                        ExtensionFinder* extension_finder,
                                        ExtensionInfo* extension,
                                        bool* was_packed_on_wire) const {
    if (!extension_finder->Find(field_number, extension)) {
      return false;
    }

    ABSL_DCHECK(extension->type > 0 &&
                extension->type <= WireFormatLite::MAX_FIELD_TYPE);
    auto real_type = static_cast<WireFormatLite::FieldType>(extension->type);

    WireFormatLite::WireType expected_wire_type =
        WireFormatLite::WireTypeForFieldType(real_type);

    // Check if this is a packed field.
    *was_packed_on_wire = false;
    if (extension->is_repeated &&
        wire_type == WireFormatLite::WIRETYPE_LENGTH_DELIMITED &&
        is_packable(expected_wire_type)) {
      *was_packed_on_wire = true;
      return true;
    }
    // Otherwise the wire type must match.
    return expected_wire_type == wire_type;
  }